

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

UninterpretedOption *
google::protobuf::DownCastMessage<google::protobuf::UninterpretedOption>(MessageLite *from)

{
  UninterpretedOption *pUVar1;
  LogMessage *pLVar2;
  LogMessage local_60 [16];
  GetTypeNameReturnType local_50;
  GetTypeNameReturnType local_30;
  
  pUVar1 = DynamicCastMessage<google::protobuf::UninterpretedOption>(from);
  if (pUVar1 == (UninterpretedOption *)from) {
    return (UninterpretedOption *)from;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message_lite.h"
             ,0x55c,0x23,"DynamicCastMessage<T>(from) == from");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (local_60,(char (*) [17])"Cannot downcast ");
  MessageLite::GetTypeName_abi_cxx11_(&local_30,from);
  pLVar2 = (LogMessage *)
           absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_30);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [5])" to ");
  MessageLite::GetTypeName_abi_cxx11_
            (&local_50,(MessageLite *)&_UninterpretedOption_default_instance_);
  absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_60);
}

Assistant:

const T* DownCastMessage(const MessageLite* from) {
  internal::StrongReferenceToType<T>();
  ABSL_DCHECK(DynamicCastMessage<T>(from) == from)
      << "Cannot downcast " << from->GetTypeName() << " to "
      << T::default_instance().GetTypeName();
  return static_cast<const T*>(from);
}